

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNextWindowCollapsed(bool collapsed,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if ((cond & cond - 1U) == 0) {
    (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
    (pIVar1->NextWindowData).CollapsedVal = collapsed;
    (pIVar1->NextWindowData).CollapsedCond = cond + (uint)(cond == 0);
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.cpp"
                ,0x19b5,"void ImGui::SetNextWindowCollapsed(bool, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowCollapsed(bool collapsed, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasCollapsed;
    g.NextWindowData.CollapsedVal = collapsed;
    g.NextWindowData.CollapsedCond = cond ? cond : ImGuiCond_Always;
}